

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O2

BOOL Js::JavascriptProxy::TestIntegrityLevel
               (IntegrityLevel integrityLevel,RecyclableObject *obj,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  JavascriptArray *pJVar5;
  Var aValue;
  byte bVar6;
  byte bVar7;
  uint i;
  uint uVar8;
  undefined1 local_98 [8];
  PropertyDescriptor propertyDescriptor;
  PropertyRecord *propertyRecord;
  undefined4 *local_50;
  undefined4 extraout_var;
  
  iVar3 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
            [0x33])(obj);
  uVar8 = 0;
  if (iVar3 == 0) {
    bVar2 = VarIsImpl<Js::JavascriptProxy>(obj);
    if (bVar2) {
      local_50 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      local_50 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *local_50 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                  ,0x4ff,"(VarIs<JavascriptProxy>(obj))",
                                  "VarIs<JavascriptProxy>(obj)");
      if (!bVar2) {
LAB_00ba7ead:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *local_50 = 0;
    }
    pJVar5 = JavascriptOperators::GetOwnPropertyKeys(obj,scriptContext);
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_98);
    bVar7 = 0;
    bVar6 = 0;
    for (uVar8 = 0; uVar8 < (pJVar5->super_ArrayObject).length; uVar8 = uVar8 + 1) {
      iVar3 = (*(pJVar5->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x72])(pJVar5,(ulong)uVar8);
      aValue = (Var)CONCAT44(extraout_var,iVar3);
      bVar2 = VarIs<Js::JavascriptSymbol>(aValue);
      if (!bVar2) {
        bVar2 = VarIs<Js::JavascriptString>(aValue);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *local_50 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                      ,0x511,
                                      "(VarIs<JavascriptSymbol>(itemVar) || VarIs<JavascriptString>(itemVar))"
                                      ,
                                      "Invariant check during ownKeys proxy trap should make sure we only get property key here. (symbol or string primitives)"
                                     );
          if (!bVar2) goto LAB_00ba7ead;
          *local_50 = 0;
        }
      }
      JavascriptConversion::ToPropertyKey
                (aValue,scriptContext,(PropertyRecord **)&propertyDescriptor.Configurable,
                 (PropertyString **)0x0);
      BVar4 = JavascriptObject::GetOwnPropertyDescriptorHelper
                        (obj,*(PropertyId *)(propertyDescriptor._40_8_ + 8),scriptContext,
                         (PropertyDescriptor *)local_98);
      if (BVar4 != 0) {
        bVar2 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)local_98);
        bVar6 = bVar6 | bVar2;
        if (propertyDescriptor.originalVar.ptr._3_1_ != '\0' ||
            (char)propertyDescriptor.originalVar.ptr != '\0') {
          bVar2 = PropertyDescriptor::IsWritable((PropertyDescriptor *)local_98);
          bVar7 = bVar7 | bVar2;
        }
      }
    }
    uVar8 = 0;
    if (bVar7 == 0) {
      uVar8 = (byte)~bVar6 & 1;
    }
    if (integrityLevel != IntegrityLevel_frozen) {
      uVar8 = (byte)~bVar6 & 1;
    }
  }
  return uVar8;
}

Assistant:

BOOL JavascriptProxy::TestIntegrityLevel(IntegrityLevel integrityLevel, RecyclableObject* obj, ScriptContext* scriptContext)
    {
        //1. Assert: Type(O) is Object.
        //2. Assert: level is either "sealed" or "frozen".

        //3. Let status be IsExtensible(O).
        //4. ReturnIfAbrupt(status).
        //5. If status is true, then return false
        //6. NOTE If the object is extensible, none of its properties are examined.
        BOOL isExtensible = obj->IsExtensible();
        if (isExtensible)
        {
            return FALSE;
        }

        // at this time this is called from proxy only; when we extend this to other objects, we need to handle the other codepath.
        //7. Let keys be O.[[OwnPropertyKeys]]().
        //8. ReturnIfAbrupt(keys).
        Assert(VarIs<JavascriptProxy>(obj));
        JavascriptArray* resultArray = JavascriptOperators::GetOwnPropertyKeys(obj, scriptContext);

        //9. Repeat for each element k of keys,
        //      a. Let currentDesc be O.[[GetOwnProperty]](k).
        //      b. ReturnIfAbrupt(currentDesc).
        //      c. If currentDesc is not undefined, then
        //          i. If currentDesc.[[Configurable]] is true, return false.
        //          ii. If level is "frozen" and IsDataDescriptor(currentDesc) is true, then
        //              1. If currentDesc.[[Writable]] is true, return false.
        Var itemVar;
        bool writable = false;
        bool configurable = false;
        const PropertyRecord* propertyRecord;
        PropertyDescriptor propertyDescriptor;
        for (uint i = 0; i < resultArray->GetLength(); i++)
        {
            itemVar = resultArray->DirectGetItem(i);
            AssertMsg(VarIs<JavascriptSymbol>(itemVar) || VarIs<JavascriptString>(itemVar), "Invariant check during ownKeys proxy trap should make sure we only get property key here. (symbol or string primitives)");
            JavascriptConversion::ToPropertyKey(itemVar, scriptContext, &propertyRecord, nullptr);
            PropertyId propertyId = propertyRecord->GetPropertyId();
            if (JavascriptObject::GetOwnPropertyDescriptorHelper(obj, propertyId, scriptContext, propertyDescriptor))
            {
                configurable |= propertyDescriptor.IsConfigurable();
                if (propertyDescriptor.IsDataDescriptor())
                {
                    writable |= propertyDescriptor.IsWritable();
                }
            }
        }
        if (integrityLevel == IntegrityLevel::IntegrityLevel_frozen && writable)
        {
            return FALSE;
        }
        if (configurable)
        {
            return FALSE;
        }
        return TRUE;
    }